

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Pack.h
# Opt level: O0

axl_va_list * __thiscall
axl::sl::PackPtrSize::operator()(PackPtrSize *this,void *p,size_t *size,axl_va_list *va)

{
  void *pvVar1;
  unsigned_long __n;
  unsigned_long *in_RCX;
  void *in_RDX;
  axl_va_list *in_RDI;
  axl_va_list *in_R8;
  size_t objSize;
  void *obj;
  axl_va_list *in_stack_ffffffffffffffa8;
  axl_va_list *src;
  
  src = in_RDI;
  pvVar1 = axl_va_list::arg<void*>(in_R8);
  __n = axl_va_list::arg<unsigned_long>(in_R8);
  *in_RCX = __n;
  if (in_RDX != (void *)0x0) {
    if (pvVar1 == (void *)0x0) {
      memset(in_RDX,0,__n);
    }
    else {
      __wrap_memcpy(in_R8,src,(size_t)in_RDI);
    }
  }
  axl_va_list::axl_va_list(in_RDI,in_stack_ffffffffffffffa8);
  return src;
}

Assistant:

axl_va_list
	operator () (
		void* p,
		size_t* size,
		axl_va_list va
	) {
		void* obj = va.arg<void*> ();
		size_t objSize = va.arg<size_t> ();

		*size = objSize;

		if (p) {
			if (obj)
				memcpy(p, obj, objSize);
			else
				memset(p, 0, objSize);
		}

		return va;
	}